

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  
  iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  if (iVar1 == 0) {
    CurrentThread::cacheTid();
    iVar1 = *(int *)(in_FS_OFFSET + -0x30);
  }
  *this->tid_ = iVar1;
  this->tid_ = (pid_t *)0x0;
  CountDownLatch::countDown(this->latch_);
  this->latch_ = (CountDownLatch *)0x0;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  *(pointer *)(in_FS_OFFSET + -0x48) = pcVar2;
  puVar3 = (undefined8 *)&DAT_0000000f;
  prctl(0xf);
  if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->func_)._M_invoker)((_Any_data *)this);
    return;
  }
  std::__throw_bad_function_call();
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  if (*(code **)(pcVar2 + 0x10) != (code *)0x0) {
    (**(code **)(pcVar2 + 0x10))();
    puVar3[3] = *(undefined8 *)(pcVar2 + 0x18);
    puVar3[2] = *(undefined8 *)(pcVar2 + 0x10);
  }
  return;
}

Assistant:

void runInThread() {
        *tid_ = CurrentThread::tid();
        tid_ = NULL;
        latch_->countDown();
        latch_ = NULL;

        CurrentThread::t_threadName = name_.c_str();
        prctl(PR_SET_NAME, CurrentThread::t_threadName);
        func_();
        
    }